

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TextFlow::Column::const_iterator::calcLength(const_iterator *this)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  unsigned_long *puVar4;
  bool bVar5;
  bool local_53;
  byte local_52;
  size_t local_40;
  size_t newLineLength;
  unsigned_long local_30;
  ulong local_28;
  unsigned_long maxParseTo;
  size_t maxLineLength;
  string *current_line;
  const_iterator *this_local;
  
  this->m_addHyphen = false;
  this->m_parsedTo = this->m_lineStart;
  maxLineLength = (size_t)this->m_column;
  current_line = (string *)this;
  pcVar2 = (char *)std::__cxx11::string::operator[](maxLineLength);
  if (*pcVar2 == '\n') {
    this->m_parsedTo = this->m_parsedTo + 1;
  }
  sVar1 = this->m_column->m_width;
  sVar3 = indentSize(this);
  maxParseTo = sVar1 - sVar3;
  local_30 = std::__cxx11::string::size();
  newLineLength = this->m_lineStart + maxParseTo;
  puVar4 = std::min<unsigned_long>(&local_30,&newLineLength);
  local_28 = *puVar4;
  while( true ) {
    bVar5 = false;
    if (this->m_parsedTo < local_28) {
      pcVar2 = (char *)std::__cxx11::string::operator[](maxLineLength);
      bVar5 = *pcVar2 != '\n';
    }
    if (!bVar5) break;
    this->m_parsedTo = this->m_parsedTo + 1;
  }
  if (this->m_parsedTo < this->m_lineStart + maxParseTo) {
    this->m_lineLength = this->m_parsedTo - this->m_lineStart;
  }
  else {
    local_40 = maxParseTo;
    while( true ) {
      local_52 = 0;
      if (local_40 != 0) {
        bVar5 = anon_unknown.dwarf_b19f3::isBoundary
                          ((string *)maxLineLength,this->m_lineStart + local_40);
        local_52 = bVar5 ^ 0xff;
      }
      if ((local_52 & 1) == 0) break;
      local_40 = local_40 - 1;
    }
    while( true ) {
      local_53 = false;
      if (local_40 != 0) {
        pcVar2 = (char *)std::__cxx11::string::operator[](maxLineLength);
        local_53 = anon_unknown.dwarf_b19f3::isWhitespace(*pcVar2);
      }
      if (local_53 == false) break;
      local_40 = local_40 - 1;
    }
    if (local_40 == 0) {
      this->m_addHyphen = true;
      this->m_lineLength = maxParseTo - 1;
    }
    else {
      this->m_lineLength = local_40;
    }
  }
  return;
}

Assistant:

void Column::const_iterator::calcLength() {
            m_addHyphen = false;
            m_parsedTo = m_lineStart;

            std::string const& current_line = m_column.m_string;
            if ( current_line[m_lineStart] == '\n' ) {
                ++m_parsedTo;
            }

            const auto maxLineLength = m_column.m_width - indentSize();
            const auto maxParseTo = std::min(current_line.size(), m_lineStart + maxLineLength);
            while ( m_parsedTo < maxParseTo &&
                    current_line[m_parsedTo] != '\n' ) {
                ++m_parsedTo;
            }

            // If we encountered a newline before the column is filled,
            // then we linebreak at the newline and consider this line
            // finished.
            if ( m_parsedTo < m_lineStart + maxLineLength ) {
                m_lineLength = m_parsedTo - m_lineStart;
            } else {
                // Look for a natural linebreak boundary in the column
                // (We look from the end, so that the first found boundary is
                // the right one)
                size_t newLineLength = maxLineLength;
                while ( newLineLength > 0 && !isBoundary( current_line, m_lineStart + newLineLength ) ) {
                    --newLineLength;
                }
                while ( newLineLength > 0 &&
                        isWhitespace( current_line[m_lineStart + newLineLength - 1] ) ) {
                    --newLineLength;
                }

                // If we found one, then that is where we linebreak
                if ( newLineLength > 0 ) {
                    m_lineLength = newLineLength;
                } else {
                    // Otherwise we have to split text with a hyphen
                    m_addHyphen = true;
                    m_lineLength = maxLineLength - 1;
                }
            }
        }